

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv_os_homedir(char *buffer,size_t *size)

{
  char *__s;
  size_t sVar1;
  int r;
  size_t len;
  char *buf;
  uv_passwd_t pwd;
  size_t *size_local;
  char *buffer_local;
  
  if (((buffer == (char *)0x0) || (size == (size_t *)0x0)) || (*size == 0)) {
    buffer_local._4_4_ = -0x16;
  }
  else {
    pwd.homedir = (char *)size;
    __s = getenv("HOME");
    if (__s == (char *)0x0) {
      buffer_local._4_4_ = uv__getpwuid_r((uv_passwd_t *)&buf);
      if (buffer_local._4_4_ == 0) {
        sVar1 = strlen(pwd.shell);
        if (sVar1 < *(ulong *)pwd.homedir) {
          memcpy(buffer,pwd.shell,sVar1 + 1);
          *(size_t *)pwd.homedir = sVar1;
          uv_os_free_passwd((uv_passwd_t *)&buf);
          buffer_local._4_4_ = 0;
        }
        else {
          *(size_t *)pwd.homedir = sVar1 + 1;
          uv_os_free_passwd((uv_passwd_t *)&buf);
          buffer_local._4_4_ = -0x69;
        }
      }
    }
    else {
      sVar1 = strlen(__s);
      if (sVar1 < *(ulong *)pwd.homedir) {
        memcpy(buffer,__s,sVar1 + 1);
        *(size_t *)pwd.homedir = sVar1;
        buffer_local._4_4_ = 0;
      }
      else {
        *(size_t *)pwd.homedir = sVar1 + 1;
        buffer_local._4_4_ = -0x69;
      }
    }
  }
  return buffer_local._4_4_;
}

Assistant:

int uv_os_homedir(char* buffer, size_t* size) {
  uv_passwd_t pwd;
  char* buf;
  size_t len;
  int r;

  if (buffer == NULL || size == NULL || *size == 0)
    return -EINVAL;

  /* Check if the HOME environment variable is set first */
  buf = getenv("HOME");

  if (buf != NULL) {
    len = strlen(buf);

    if (len >= *size) {
      *size = len + 1;
      return -ENOBUFS;
    }

    memcpy(buffer, buf, len + 1);
    *size = len;

    return 0;
  }

  /* HOME is not set, so call uv__getpwuid_r() */
  r = uv__getpwuid_r(&pwd);

  if (r != 0) {
    return r;
  }

  len = strlen(pwd.homedir);

  if (len >= *size) {
    *size = len + 1;
    uv_os_free_passwd(&pwd);
    return -ENOBUFS;
  }

  memcpy(buffer, pwd.homedir, len + 1);
  *size = len;
  uv_os_free_passwd(&pwd);

  return 0;
}